

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary_impl.hpp
# Opt level: O2

int __thiscall
ylt::metric::detail::summary_impl<unsigned_int,_6UL>::stat
          (summary_impl<unsigned_int,_6UL> *this,char *__file,stat *__buf)

{
  data_t *this_00;
  data_t *this_01;
  double *pdVar1;
  long lVar2;
  ushort uVar3;
  ulong uVar4;
  ushort uVar5;
  long *in_RCX;
  long lVar6;
  EVP_PKEY_CTX *ctx;
  double *pdVar7;
  double dVar8;
  undefined1 auVar9 [16];
  uint uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  vector<float,_std::allocator<float>_> *result;
  float v;
  data_copy_t data_copy;
  undefined8 local_a0;
  int local_94;
  long *local_90;
  undefined1 local_88 [24];
  undefined1 auStack_70 [32];
  __gid_t local_50;
  undefined1 local_48 [16];
  
  refresh((summary_impl<unsigned_int,_6UL> *)__file);
  *in_RCX = 0;
  __buf->st_dev = 0;
  auStack_70._8_8_ = (pointer)0x0;
  auStack_70._16_8_ = (pointer)0x0;
  local_88._16_8_ = (pointer)0x0;
  auStack_70._0_8_ = (pointer)0x0;
  local_88._0_8_ = (pointer)0x0;
  local_88._8_8_ = (pointer)0x0;
  auStack_70._24_4_ = 0;
  auStack_70._28_4_ = 0;
  this_00 = *(data_t **)(__file + 0x18);
  this_01 = *(data_t **)(__file + 0x20);
  if (this_01 == (data_t *)0x0 && this_00 == (data_t *)0x0) {
    local_a0 = local_a0 & 0xffffffff00000000;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)this,
               (*(long **)(__file + 0x10))[1] - **(long **)(__file + 0x10) >> 3,
               (value_type_conflict4 *)&local_a0,(allocator_type *)&local_94);
  }
  else {
    local_90 = in_RCX;
    if (this_00 != (data_t *)0x0) {
      data_t::stat(this_00,(char *)in_RCX,(stat *)local_88);
    }
    if (this_01 != (data_t *)0x0) {
      data_t::stat(this_01,(char *)local_90,(stat *)auStack_70);
    }
    if (*local_90 == 0) {
      local_a0 = (ulong)local_a0._4_4_ << 0x20;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)this,
                 (*(long **)(__file + 0x10))[1] - **(long **)(__file + 0x10) >> 3,
                 (value_type_conflict4 *)&local_a0,(allocator_type *)&local_94);
    }
    else {
      local_a0 = 0x2000;
      local_94 = 0;
      std::vector<std::pair<short,unsigned_int>,std::allocator<std::pair<short,unsigned_int>>>::
      emplace_back<unsigned_long,int>
                ((vector<std::pair<short,unsigned_int>,std::allocator<std::pair<short,unsigned_int>>>
                  *)local_88,&local_a0,&local_94);
      ctx = (EVP_PKEY_CTX *)&local_a0;
      local_a0 = 0x2000;
      local_94 = 0;
      std::vector<std::pair<short,unsigned_int>,std::allocator<std::pair<short,unsigned_int>>>::
      emplace_back<unsigned_long,int>
                ((vector<std::pair<short,unsigned_int>,std::allocator<std::pair<short,unsigned_int>>>
                  *)auStack_70,(unsigned_long *)ctx,&local_94);
      data_copy_t::init((data_copy_t *)local_88,ctx);
      (this->refresh_time_).__r = 0;
      (this->tp_).super___atomic_base<unsigned_long>._M_i = 0;
      this->rate_ = (vector<double,_std::allocator<double>_> *)0x0;
      std::vector<float,_std::allocator<float>_>::reserve
                ((vector<float,_std::allocator<float>_> *)this,
                 (*(long **)(__file + 0x10))[1] - **(long **)(__file + 0x10) >> 3);
      local_a0 = CONCAT44(local_a0._4_4_,0xdf800000);
      pdVar1 = (double *)(*(undefined8 **)(__file + 0x10))[1];
      lVar6 = 0;
      for (pdVar7 = (double *)**(undefined8 **)(__file + 0x10); pdVar7 != pdVar1;
          pdVar7 = pdVar7 + 1) {
        dVar8 = *pdVar7;
        if (0.0 <= dVar8) {
          uVar10 = 0x3ff00000;
          if (1.0 < dVar8) {
            dVar8 = 1.0;
          }
          lVar2 = *local_90;
          auVar11._8_4_ = (int)((ulong)lVar2 >> 0x20);
          auVar11._0_8_ = lVar2;
          auVar11._12_4_ = 0x45300000;
          auVar12._8_8_ = auVar11._8_8_ - 1.9342813113834067e+25;
          if (lVar2 == 0) {
            uVar10 = 0;
          }
          dVar13 = auVar12._8_8_ + ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0);
          if (dVar8 * dVar13 <= dVar13) {
            dVar13 = dVar8 * dVar13;
          }
          auVar12._0_8_ = ~-(ulong)(dVar8 == 0.0) & (ulong)dVar13;
          local_48 = auVar12 | ZEXT416(uVar10 & (uint)(-(ulong)(dVar8 == 0.0) >> 0x20)) << 0x20;
          while (auVar9._8_4_ = (int)((ulong)lVar6 >> 0x20), auVar9._0_8_ = lVar6,
                auVar9._12_4_ = 0x45300000,
                (auVar9._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0) <
                (double)local_48._0_8_) {
            uVar4 = (ulong)*(uint *)(*(long *)(local_88 + (long)(int)local_50 * 0x18) + 4 +
                                    (long)*(int *)(auStack_70 + (long)(int)local_50 * 4 + 0x18) * 8)
            ;
            uVar3 = (ushort)*(undefined4 *)
                             (*(long *)(local_88 + (long)(int)local_50 * 0x18) +
                             (long)*(int *)(auStack_70 + (long)(int)local_50 * 4 + 0x18) * 8);
            uVar5 = 0x1fff - uVar3;
            if (-1 < (short)uVar3) {
              uVar5 = uVar3;
            }
            lVar6 = lVar6 + uVar4;
            local_a0 = CONCAT44(local_a0._4_4_,
                                *(float *)(summary_impl<unsigned_int,6ul>::get_decode_table()::table
                                          + (ulong)uVar5 * 4));
            __buf->st_dev =
                 (__dev_t)((double)((float)uVar4 *
                                   *(float *)(summary_impl<unsigned_int,6ul>::get_decode_table()::
                                              table + (ulong)uVar5 * 4)) + (double)__buf->st_dev);
            data_copy_t::inc((data_copy_t *)local_88);
          }
          std::vector<float,_std::allocator<float>_>::push_back
                    ((vector<float,_std::allocator<float>_> *)this,(value_type_conflict4 *)&local_a0
                    );
        }
        else {
          std::vector<float,_std::allocator<float>_>::push_back
                    ((vector<float,_std::allocator<float>_> *)this,(value_type_conflict4 *)&local_a0
                    );
        }
      }
      while( true ) {
        uVar4 = (ulong)*(ushort *)
                        (*(long *)(local_88 + (long)(int)local_50 * 0x18) +
                        (long)*(int *)(auStack_70 + (long)(int)local_50 * 4 + 0x18) * 8);
        if (0x1fff < uVar4) break;
        __buf->st_dev =
             (__dev_t)((double)((float)*(uint *)(*(long *)(local_88 + (long)(int)local_50 * 0x18) +
                                                 4 + (long)*(int *)(auStack_70 +
                                                                   (long)(int)local_50 * 4 + 0x18) *
                                                     8) *
                               *(float *)(summary_impl<unsigned_int,6ul>::get_decode_table()::table
                                         + uVar4 * 4)) + (double)__buf->st_dev);
        data_copy_t::inc((data_copy_t *)local_88);
      }
    }
  }
  data_copy_t::~data_copy_t((data_copy_t *)local_88);
  return (int)this;
}

Assistant:

std::vector<float> stat(double& sum, uint64_t& count) {
    refresh();
    count = 0;
    sum = 0;
    data_copy_t data_copy;
    {
      data_t* ar[2] = {data_[0], data_[1]};
      if (ar[0] == nullptr && ar[1] == nullptr) [[unlikely]] {
        return std::vector<float>(rate_.size(), 0.0f);
      }
      if (ar[0]) {
        ar[0]->stat(count, data_copy.arr[0]);
      }
      if (ar[1]) {
        ar[1]->stat(count, data_copy.arr[1]);
      }
    }
    if (count == 0) {
      return std::vector<float>(rate_.size(), 0);
    }
    uint64_t count_now = 0;
    data_copy.arr[0].emplace_back(bucket_size / 2, 0);
    data_copy.arr[1].emplace_back(bucket_size / 2, 0);
    data_copy.init();
    std::vector<float> result;
    result.reserve(rate_.size());
    float v = -float16_max;
    for (double e : rate_) {
      if (std::isnan(e) || e < 0) {
        result.push_back(v);
        continue;
      }
      else if (e > 1) [[unlikely]] {
        e = 1;
      }
      auto target_count = std::min<double>(e * count, count);
      if (e == 0) {
        target_count = std::min(uint64_t{1}, count);
      }
      while (true) {
        if (target_count <= count_now) [[unlikely]] {
          result.push_back(v);
          break;
        }
        auto tmp = data_copy.count();
        count_now += tmp;
        v = decode(data_t::get_raw_index(data_copy.value()));
        sum += v * tmp;
        data_copy.inc();
      }
    }
    while (data_copy.value() < bucket_size / 2) {
      sum +=
          decode(data_t::get_raw_index(data_copy.value())) * data_copy.count();
      data_copy.inc();
    }
    return result;
  }